

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_prove_s256_lowmc_192_192_4(mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec)

{
  word256 in_stack_00000358;
  word256 in_stack_00000378;
  word256 in_stack_00000398;
  rvec_t *in_stack_000003b8;
  view_t *in_stack_000003c0;
  mzd_local_t *in_stack_000003c8;
  mzd_local_t *in_stack_000003d0;
  
  vpunpcklqdq_avx(ZEXT816(0x9249249249249249),ZEXT816(0x4924924924924924));
  vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0));
  vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0));
  vpunpcklqdq_avx(ZEXT816(0x9249249249249249),ZEXT816(0));
  vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  mpc_sbox_prove_s256_256
            (in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
             in_stack_00000398,in_stack_00000378,in_stack_00000358);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void mpc_sbox_prove_s256_lowmc_192_192_4(mzd_local_t* out, const mzd_local_t* in,
                                                view_t* view, const rvec_t* rvec) {
  mpc_sbox_prove_s256_256(out, in, view, rvec,
                          mm256_set_4(MASK_192_192_64_A_0, MASK_192_192_64_A_1, MASK_192_192_64_A_2,
                                      MASK_192_192_64_A_3),
                          mm256_set_4(MASK_192_192_64_B_0, MASK_192_192_64_B_1, MASK_192_192_64_B_2,
                                      MASK_192_192_64_B_3),
                          mm256_set_4(MASK_192_192_64_C_0, MASK_192_192_64_C_1, MASK_192_192_64_C_2,
                                      MASK_192_192_64_C_3));
}